

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_parse_uri(char *p,char **prot,char **ads,int *port,char **path)

{
  char cVar1;
  char **ppcVar2;
  int iVar3;
  bool bVar4;
  char unix_skt;
  char *end;
  char **path_local;
  int *port_local;
  char **ads_local;
  char **prot_local;
  char *p_local;
  
  *prot = p;
  prot_local = (char **)p;
  while( true ) {
    bVar4 = false;
    if (((*(char *)prot_local != '\0') && (bVar4 = true, *(char *)prot_local == ':')) &&
       (bVar4 = true, *(char *)((long)prot_local + 1) == '/')) {
      bVar4 = *(char *)((long)prot_local + 2) != '/';
    }
    if (!bVar4) break;
    prot_local = (char **)((long)prot_local + 1);
  }
  if (*(char *)prot_local == '\0') {
    ppcVar2 = (char **)*prot;
    *prot = (char *)prot_local;
    prot_local = ppcVar2;
  }
  else {
    *(undefined1 *)prot_local = 0;
    prot_local = (char **)((long)prot_local + 3);
  }
  cVar1 = *(char *)prot_local;
  *ads = (char *)prot_local;
  iVar3 = strcmp(*prot,"http");
  if ((iVar3 == 0) || (iVar3 = strcmp(*prot,"ws"), iVar3 == 0)) {
    *port = 0x50;
  }
  else {
    iVar3 = strcmp(*prot,"https");
    if ((iVar3 == 0) || (iVar3 = strcmp(*prot,"wss"), iVar3 == 0)) {
      *port = 0x1bb;
    }
  }
  if (*(char *)prot_local == '[') {
    *ads = *ads + 1;
    while( true ) {
      bVar4 = false;
      if (*(char *)prot_local != '\0') {
        bVar4 = *(char *)prot_local != ']';
      }
      if (!bVar4) break;
      prot_local = (char **)((long)prot_local + 1);
    }
    if (*(char *)prot_local != '\0') {
      *(undefined1 *)prot_local = 0;
      prot_local = (char **)((long)prot_local + 1);
    }
  }
  else {
    while( true ) {
      bVar4 = false;
      if (((*(char *)prot_local != '\0') && (bVar4 = false, *(char *)prot_local != ':')) &&
         (bVar4 = true, cVar1 != '+')) {
        bVar4 = *(char *)prot_local != '/';
      }
      if (!bVar4) break;
      prot_local = (char **)((long)prot_local + 1);
    }
  }
  if (*(char *)prot_local == ':') {
    *(undefined1 *)prot_local = 0;
    iVar3 = atoi((char *)((long)prot_local + 1));
    *port = iVar3;
    prot_local = (char **)((long)prot_local + 1);
    while( true ) {
      bVar4 = false;
      if (*(char *)prot_local != '\0') {
        bVar4 = *(char *)prot_local != '/';
      }
      if (!bVar4) break;
      prot_local = (char **)((long)prot_local + 1);
    }
  }
  *path = "/";
  if (*(char *)prot_local != '\0') {
    *(undefined1 *)prot_local = 0;
    if (*(char *)((long)prot_local + 1) != '\0') {
      *path = (char *)((long)prot_local + 1);
    }
  }
  return 0;
}

Assistant:

int
lws_parse_uri(char *p, const char **prot, const char **ads, int *port,
	      const char **path)
{
	const char *end;
	char unix_skt = 0;

	/* cut up the location into address, port and path */
	*prot = p;
	while (*p && (*p != ':' || p[1] != '/' || p[2] != '/'))
		p++;
	if (!*p) {
		end = p;
		p = (char *)*prot;
		*prot = end;
	} else {
		*p = '\0';
		p += 3;
	}
	if (*p == '+') /* unix skt */
		unix_skt = 1;

	*ads = p;
	if (!strcmp(*prot, "http") || !strcmp(*prot, "ws"))
		*port = 80;
	else if (!strcmp(*prot, "https") || !strcmp(*prot, "wss"))
		*port = 443;

	if (*p == '[') {
		++(*ads);
		while (*p && *p != ']')
			p++;
		if (*p)
			*p++ = '\0';
	} else
		while (*p && *p != ':' && (unix_skt || *p != '/'))
			p++;

	if (*p == ':') {
		*p++ = '\0';
		*port = atoi(p);
		while (*p && *p != '/')
			p++;
	}
	*path = "/";
	if (*p) {
		*p++ = '\0';
		if (*p)
			*path = p;
	}

	return 0;
}